

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode DataValue_encodeBinary(UA_DataValue *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint uVar2;
  UA_StatusCode UVar3;
  
  UVar3 = 0x80080000;
  if (pos + 1 <= end) {
    *pos = *(byte *)src & 0x3f;
    pos = pos + 1;
    UVar3 = 0;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
    UVar1 = Variant_encodeBinary(&src->value,_);
    UVar3 = UVar3 | UVar1;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
    uVar2 = 0x80080000;
    if (pos + 4 <= end) {
      *(UA_StatusCode *)pos = src->status;
      pos = pos + 4;
      uVar2 = 0;
    }
    UVar3 = UVar3 | uVar2;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x4) != (undefined1  [96])0x0) {
    uVar2 = 0x80080000;
    if (pos + 8 <= end) {
      *(UA_DateTime *)pos = src->sourceTimestamp;
      pos = pos + 8;
      uVar2 = 0;
    }
    UVar3 = UVar3 | uVar2;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x10) != (undefined1  [96])0x0)
  {
    uVar2 = 0x80080000;
    if (pos + 2 <= end) {
      *(UA_UInt16 *)pos = src->sourcePicoseconds;
      pos = pos + 2;
      uVar2 = 0;
    }
    UVar3 = UVar3 | uVar2;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x8) != (undefined1  [96])0x0) {
    uVar2 = 0x80080000;
    if (pos + 8 <= end) {
      *(UA_DateTime *)pos = src->serverTimestamp;
      pos = pos + 8;
      uVar2 = 0;
    }
    UVar3 = UVar3 | uVar2;
  }
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x20) != (undefined1  [96])0x0)
  {
    uVar2 = 0x80080000;
    if (pos + 2 <= end) {
      *(UA_UInt16 *)pos = src->serverPicoseconds;
      pos = pos + 2;
      uVar2 = 0;
    }
    UVar3 = UVar3 | uVar2;
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
DataValue_encodeBinary(UA_DataValue const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encodingMask = (UA_Byte)
        (src->hasValue | (src->hasStatus << 1) | (src->hasSourceTimestamp << 2) |
         (src->hasServerTimestamp << 3) | (src->hasSourcePicoseconds << 4) |
         (src->hasServerPicoseconds << 5));

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encodingMask, NULL);
    if(src->hasValue)
        retval |= Variant_encodeBinary(&src->value, NULL);
    if(src->hasStatus)
        retval |= StatusCode_encodeBinary(&src->status);
    if(src->hasSourceTimestamp)
        retval |= DateTime_encodeBinary(&src->sourceTimestamp);
    if(src->hasSourcePicoseconds)
        retval |= UInt16_encodeBinary(&src->sourcePicoseconds, NULL);
    if(src->hasServerTimestamp)
        retval |= DateTime_encodeBinary(&src->serverTimestamp);
    if(src->hasServerPicoseconds)
        retval |= UInt16_encodeBinary(&src->serverPicoseconds, NULL);
    return retval;
}